

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O0

int carith_checkarg(lua_State *L,CTState *cts,CDArith *ca)

{
  CTypeID CVar1;
  long in_RDX;
  CTState *in_RSI;
  long in_RDI;
  CType *cct;
  CTSize ofs;
  CType *ct_2;
  TValue *o2;
  uint8_t *p;
  CType *ct;
  CTypeID id;
  GCcdata *cd;
  MSize i;
  int ok;
  TValue *o;
  CType *ct_3;
  CType *ct_1;
  int in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  CTState *in_stack_fffffffffffffda0;
  CTState *in_stack_fffffffffffffda8;
  CType *in_stack_fffffffffffffdb0;
  GCstr *in_stack_fffffffffffffdb8;
  uint *local_230;
  CType *local_228;
  uint local_210;
  int local_20c;
  uint *local_208;
  CType *local_1e8;
  CType *local_1d0;
  CType *local_58;
  uint *local_8;
  
  local_208 = *(uint **)(in_RDI + 0x10);
  local_20c = 1;
  if (*(uint **)(in_RDI + 0x18) <= local_208 + 2) {
    lj_err_argt((lua_State *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                in_stack_fffffffffffffd98);
  }
  local_210 = 0;
  do {
    if (1 < local_210) {
      return local_20c;
    }
    if (local_208[1] == 0xfffffff5) {
      for (local_1d0 = in_RSI->tab + *(ushort *)((ulong)*local_208 + 6);
          local_1d0->info >> 0x1c == 8; local_1d0 = in_RSI->tab + (local_1d0->info & 0xffff)) {
      }
      local_228 = local_1d0;
      local_230 = (uint *)((ulong)*local_208 + 8);
      if (local_1d0->info >> 0x1c == 2) {
        if (local_1d0->size == 4) {
          local_8 = (uint *)(ulong)*local_230;
        }
        else {
          local_8 = *(uint **)local_230;
        }
        local_230 = local_8;
        if ((local_1d0->info & 0xf0800000) == 0x20800000) {
          local_58 = local_1d0;
          do {
            local_228 = in_RSI->tab + (local_58->info & 0xffff);
            local_58 = local_228;
          } while (local_228->info >> 0x1c == 8);
        }
      }
      else if (local_1d0->info >> 0x1c == 6) {
        local_230 = *(uint **)local_230;
        in_stack_fffffffffffffda8 = in_RSI;
        CVar1 = lj_ctype_intern(in_RSI,(CTInfo)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                (CTSize)in_stack_fffffffffffffda0);
        local_228 = in_stack_fffffffffffffda8->tab + CVar1;
      }
      if (local_228->info >> 0x1c == 5) {
        local_228 = in_RSI->tab + (local_228->info & 0xffff);
      }
      *(CType **)(in_RDX + 0x10 + (ulong)local_210 * 8) = local_228;
      *(uint **)(in_RDX + (ulong)local_210 * 8) = local_230;
    }
    else if (local_208[1] < 0xfffeffff) {
      *(CType **)(in_RDX + 0x10 + (ulong)local_210 * 8) = in_RSI->tab + 0xe;
      *(uint **)(in_RDX + (ulong)local_210 * 8) = local_208;
    }
    else if (local_208[1] == 0xffffffff) {
      *(CType **)(in_RDX + 0x10 + (ulong)local_210 * 8) = in_RSI->tab + 0x11;
      *(undefined8 *)(in_RDX + (ulong)local_210 * 8) = 0;
    }
    else if (local_208[1] == 0xfffffffb) {
      if (local_210 == 0) {
        in_stack_fffffffffffffda0 = (CTState *)(local_208 + 2);
      }
      else {
        in_stack_fffffffffffffda0 = (CTState *)(local_208 + -2);
      }
      for (local_1e8 = in_RSI->tab +
                       *(ushort *)((ulong)*(uint *)&in_stack_fffffffffffffda0->tab + 6);
          local_1e8->info >> 0x1c == 8; local_1e8 = in_RSI->tab + (local_1e8->info & 0xffff)) {
      }
      *(undefined8 *)(in_RDX + 0x10 + (ulong)local_210 * 8) = 0;
      *(ulong *)(in_RDX + (ulong)local_210 * 8) = (ulong)*local_208 + 0x10;
      local_20c = 0;
      if (local_1e8->info >> 0x1c == 5) {
        in_stack_fffffffffffffdb0 =
             lj_ctype_getfieldq(in_stack_fffffffffffffda0,local_1e8,in_stack_fffffffffffffdb8,
                                &in_stack_fffffffffffffdb0->info,(CTInfo *)in_stack_fffffffffffffda8
                               );
        if ((in_stack_fffffffffffffdb0 == (CType *)0x0) ||
           (in_stack_fffffffffffffdb0->info >> 0x1c != 0xb)) {
          *(CType **)(in_RDX + 0x10 + (ulong)(1 - local_210) * 8) = local_1e8;
          *(undefined8 *)(in_RDX + (ulong)(1 - local_210) * 8) = 0;
          return 0;
        }
        *(CType **)(in_RDX + 0x10 + (ulong)local_210 * 8) =
             in_RSI->tab + (in_stack_fffffffffffffdb0->info & 0xffff);
        *(CTSize **)(in_RDX + (ulong)local_210 * 8) = &in_stack_fffffffffffffdb0->size;
        local_20c = 1;
      }
    }
    else {
      *(undefined8 *)(in_RDX + 0x10 + (ulong)local_210 * 8) = 0;
      *(undefined8 *)(in_RDX + (ulong)local_210 * 8) = 1;
      local_20c = 0;
    }
    local_210 = local_210 + 1;
    local_208 = local_208 + 2;
  } while( true );
}

Assistant:

static int carith_checkarg(lua_State *L, CTState *cts, CDArith *ca)
{
  TValue *o = L->base;
  int ok = 1;
  MSize i;
  if (o+1 >= L->top)
    lj_err_argt(L, 1, LUA_TCDATA);
  for (i = 0; i < 2; i++, o++) {
    if (tviscdata(o)) {
      GCcdata *cd = cdataV(o);
      CTypeID id = (CTypeID)cd->ctypeid;
      CType *ct = ctype_raw(cts, id);
      uint8_t *p = (uint8_t *)cdataptr(cd);
      if (ctype_isptr(ct->info)) {
	p = (uint8_t *)cdata_getptr(p, ct->size);
	if (ctype_isref(ct->info)) ct = ctype_rawchild(cts, ct);
      } else if (ctype_isfunc(ct->info)) {
	p = (uint8_t *)*(void **)p;
	ct = ctype_get(cts,
	  lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR));
      }
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      ca->ct[i] = ct;
      ca->p[i] = p;
    } else if (tvisint(o)) {
      ca->ct[i] = ctype_get(cts, CTID_INT32);
      ca->p[i] = (uint8_t *)&o->i;
    } else if (tvisnum(o)) {
      ca->ct[i] = ctype_get(cts, CTID_DOUBLE);
      ca->p[i] = (uint8_t *)&o->n;
    } else if (tvisnil(o)) {
      ca->ct[i] = ctype_get(cts, CTID_P_VOID);
      ca->p[i] = (uint8_t *)0;
    } else if (tvisstr(o)) {
      TValue *o2 = i == 0 ? o+1 : o-1;
      CType *ct = ctype_raw(cts, cdataV(o2)->ctypeid);
      ca->ct[i] = NULL;
      ca->p[i] = (uint8_t *)strVdata(o);
      ok = 0;
      if (ctype_isenum(ct->info)) {
	CTSize ofs;
	CType *cct = lj_ctype_getfield(cts, ct, strV(o), &ofs);
	if (cct && ctype_isconstval(cct->info)) {
	  ca->ct[i] = ctype_child(cts, cct);
	  ca->p[i] = (uint8_t *)&cct->size;  /* Assumes ct does not grow. */
	  ok = 1;
	} else {
	  ca->ct[1-i] = ct;  /* Use enum to improve error message. */
	  ca->p[1-i] = NULL;
	  break;
	}
      }
    } else {
      ca->ct[i] = NULL;
      ca->p[i] = (void *)(intptr_t)1;  /* To make it unequal. */
      ok = 0;
    }
  }
  return ok;
}